

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmAppendPathSegmentGenerator&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmAppendPathSegmentGenerator *gen,cmCaseInsensitiveDirectoryListGenerator *tail)

{
  byte bVar1;
  bool bVar2;
  string local_88;
  int local_54;
  undefined1 local_50 [8];
  string path;
  cmCaseInsensitiveDirectoryListGenerator *tail_local;
  cmAppendPathSegmentGenerator *gen_local;
  string *startPath_local;
  anon_class_8_1_8991fb9c *filesCollector_local;
  
  path.field_2._8_8_ = tail;
  ResetGenerator<(anonymous_namespace)::cmAppendPathSegmentGenerator&>(gen);
  anon_unknown.dwarf_ab50d4::cmAppendPathSegmentGenerator::GetNextCandidate
            ((string *)local_50,gen,startPath);
  do {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      local_54 = 2;
LAB_005da564:
      std::__cxx11::string::~string((string *)local_50);
      if (local_54 != 1) {
        filesCollector_local._7_1_ = 0;
      }
      return (bool)(filesCollector_local._7_1_ & 1);
    }
    ResetGenerator<(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
              ((cmCaseInsensitiveDirectoryListGenerator *)path.field_2._8_8_);
    bVar2 = TryGeneratedPaths<cmFindPackageCommand::SearchFrameworkPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmCaseInsensitiveDirectoryListGenerator&>
                      (filesCollector,(string *)local_50,
                       (cmCaseInsensitiveDirectoryListGenerator *)path.field_2._8_8_);
    if (bVar2) {
      filesCollector_local._7_1_ = 1;
      local_54 = 1;
      goto LAB_005da564;
    }
    anon_unknown.dwarf_ab50d4::cmAppendPathSegmentGenerator::GetNextCandidate
              (&local_88,gen,startPath);
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  } while( true );
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}